

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

void __thiscall
glcts::StateInteractionCase::generateVarLinkFragmentShaderSrc
          (StateInteractionCase *this,string *outFragSrc,GLSLVersion glslVersion,int numInputs)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ostringstream fragSrc;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"precision highp int;\n",0x15);
  uVar4 = (ulong)(numInputs - 1U);
  switch(uVar4) {
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"layout(location = 3) in vec4 i_val5;\n",0x25);
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"flat in uvec4 val4;\n",0x14);
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"flat in ivec2 val3;\n",0x14);
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"in vec3 val2[2];\n",0x11);
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"in vec4 val1;\n",0xe);
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"in float val0;\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
    if (numInputs - 1U < 5) {
      pcVar1 = &DAT_01b2d180 + *(int *)(&DAT_01b2d180 + uVar4 * 4);
      lVar3 = *(long *)(&DAT_01b2d198 + uVar4 * 8);
    }
    else {
      lVar3 = 0x2b;
      pcVar1 = "    o_color = vec4(val0, val0, val0, 1.0);\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,lVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)outFragSrc,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    return;
  }
}

Assistant:

void generateVarLinkFragmentShaderSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion, int numInputs)
	{
		std::ostringstream fragSrc;

		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		fragSrc << "precision highp float;\n";
		fragSrc << "precision highp int;\n";

		switch (numInputs)
		{
		// Note all these cases fall through
		case 5:
			fragSrc << "layout(location = 3) in vec4 i_val5;\n";
		case 4:
			fragSrc << "flat in uvec4 val4;\n";
		case 3:
			fragSrc << "flat in ivec2 val3;\n";
		case 2:
			fragSrc << "in vec3 val2[2];\n";
		case 1:
			fragSrc << "in vec4 val1;\n";
		default:
			fragSrc << "in float val0;\n";
		}

		fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
		fragSrc << "void main (void)\n";
		fragSrc << "{\n";

		switch (numInputs)
		{
		case 5:
			fragSrc << "    o_color = i_val5;\n";
			break;
		case 4:
			fragSrc << "    o_color = vec4(val4);\n";
			break;
		case 3:
			fragSrc << "    o_color = vec4(val3, 1.0, 1.0);\n";
			break;
		case 2:
			fragSrc << "    o_color = vec4(val2[0], 1.0);\n";
			break;
		case 1:
			fragSrc << "    o_color = vec4(val1);\n";
			break;
		default:
			fragSrc << "    o_color = vec4(val0, val0, val0, 1.0);\n";
			break;
		}

		fragSrc << "}\n";

		outFragSrc = fragSrc.str();
	}